

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_normal_octahedron_canonicalized_decoding_transform.h
# Opt level: O0

void __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DataType *pred_vals,CorrType *corr_vals,DataType *out_orig_vals)

{
  Scalar_conflict3 *pSVar1;
  Scalar_conflict3 *in_RCX;
  VectorD<int,_2> *in_RDI;
  Point2 orig;
  Point2 corr;
  Point2 pred;
  PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *in_stack_00000058;
  int in_stack_ffffffffffffffac;
  Self *in_stack_ffffffffffffffb8;
  VectorD<int,_2> *in_stack_ffffffffffffffc0;
  Scalar_conflict3 *in_stack_ffffffffffffffc8;
  VectorD<int,_2> *in_stack_ffffffffffffffd0;
  
  VectorD<int,_2>::VectorD
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (Scalar_conflict3 *)in_stack_ffffffffffffffc0);
  VectorD<int,_2>::VectorD
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (Scalar_conflict3 *)in_stack_ffffffffffffffc0);
  VectorD<int,_2>::VectorD(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VectorD<int,_2>::VectorD(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ComputeOriginalValue(in_stack_00000058,(Point2 *)this,(Point2 *)pred_vals);
  pSVar1 = VectorD<int,_2>::operator[](in_RDI,in_stack_ffffffffffffffac);
  *in_RCX = *pSVar1;
  pSVar1 = VectorD<int,_2>::operator[](in_RDI,in_stack_ffffffffffffffac);
  in_RCX[1] = *pSVar1;
  return;
}

Assistant:

inline void ComputeOriginalValue(const DataType *pred_vals,
                                   const CorrType *corr_vals,
                                   DataType *out_orig_vals) const {
    DRACO_DCHECK_LE(pred_vals[0], 2 * this->center_value());
    DRACO_DCHECK_LE(pred_vals[1], 2 * this->center_value());
    DRACO_DCHECK_LE(corr_vals[0], 2 * this->center_value());
    DRACO_DCHECK_LE(corr_vals[1], 2 * this->center_value());

    DRACO_DCHECK_LE(0, pred_vals[0]);
    DRACO_DCHECK_LE(0, pred_vals[1]);
    DRACO_DCHECK_LE(0, corr_vals[0]);
    DRACO_DCHECK_LE(0, corr_vals[1]);

    const Point2 pred = Point2(pred_vals[0], pred_vals[1]);
    const Point2 corr = Point2(corr_vals[0], corr_vals[1]);
    const Point2 orig = ComputeOriginalValue(pred, corr);

    out_orig_vals[0] = orig[0];
    out_orig_vals[1] = orig[1];
  }